

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::CompilerGLSL::type_to_packed_size
          (CompilerGLSL *this,SPIRType *type,Bitset *flags,BufferPackingStandard packing)

{
  BufferPackingStandard packing_00;
  CompilerGLSL *this_00;
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  mapped_type *pmVar5;
  SPIRType *pSVar6;
  CompilerError *pCVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  allocator local_a5;
  BufferPackingStandard local_a4;
  CompilerGLSL *local_a0;
  SPIRType *local_98;
  ID *local_90;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_88;
  ulong local_80;
  ulong local_78;
  Bitset member_flags;
  
  if ((type->array).super_VectorView<unsigned_int>.buffer_size == 0) {
    if (type->storage == StorageClassPhysicalStorageBuffer) {
      if (type->pointer == false) {
        pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&member_flags,"Types in PhysicalStorageBufferEXT must be pointers.",
                   &local_a5);
        CompilerError::CompilerError(pCVar7,(string *)&member_flags);
        __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((this->super_Compiler).ir.addressing_model != AddressingModelPhysicalStorageBuffer64) {
        pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&member_flags,
                   "AddressingModelPhysicalStorageBuffer64EXT must be used for PhysicalStorageBufferEXT."
                   ,&local_a5);
        CompilerError::CompilerError(pCVar7,(string *)&member_flags);
        __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_78 = 8;
      goto LAB_00244d37;
    }
    if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
      local_88 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&(this->super_Compiler).ir.meta;
      local_90 = &(type->super_IVariant).self;
      local_78 = 0;
      uVar11 = 1;
      local_a4 = packing;
      local_a0 = this;
      local_98 = type;
      for (uVar8 = 0; pSVar6 = local_98, this_00 = local_a0, uVar9 = (ulong)uVar8,
          uVar9 < (local_98->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
          uVar8 = uVar8 + 1) {
        local_80 = uVar11;
        pmVar5 = ::std::__detail::
                 _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[](local_88,local_90);
        Bitset::Bitset(&member_flags,
                       &(pmVar5->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr[uVar9]
                        .decoration_flags);
        pSVar6 = Compiler::get<spirv_cross::SPIRType>
                           (&this_00->super_Compiler,
                            (pSVar6->member_types).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                            [uVar9].id);
        packing_00 = local_a4;
        uVar1 = type_to_packed_alignment(this_00,pSVar6,&member_flags,local_a4);
        iVar4 = *(int *)&(pSVar6->super_IVariant).field_0xc;
        uVar2 = type_to_packed_size(this_00,pSVar6,&member_flags,packing_00);
        uVar11 = 1;
        if (iVar4 == 0xf) {
          uVar11 = (ulong)uVar1;
        }
        uVar3 = (uint)local_80;
        if ((uint)local_80 < uVar1) {
          uVar3 = uVar1;
        }
        iVar4 = (int)local_78;
        ::std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&member_flags.higher._M_h);
        local_78 = (ulong)(uVar2 + (-uVar3 & (iVar4 + uVar3) - 1));
      }
      goto LAB_00244d37;
    }
    uVar1 = type_to_packed_base_size(this,type,(BufferPackingStandard)flags);
    if ((packing & ~BufferPackingStd430) != BufferPackingScalar) {
      uVar8 = type->vecsize;
      uVar3 = type->columns;
      uVar10 = uVar8 * uVar1;
      local_78 = 0;
      if (uVar3 == 1) {
        local_78 = (ulong)uVar10;
      }
      uVar11 = flags->lower;
      if ((1 < uVar3 & (byte)((uVar11 & 0xffffffff) >> 5) & 7) == 1) {
        if ((packing < BufferPackingScalar) && ((0x35U >> (packing & 0x1f) & 1) != 0)) {
          local_78 = (ulong)(uVar1 * uVar3 * 4);
          goto LAB_00244ec7;
        }
        if (uVar8 != 3) {
          local_78 = (ulong)(uVar10 * uVar3);
          goto LAB_00244ec7;
        }
        if ((uVar11 & 0x10) != 0) goto LAB_00244ed6;
        local_78 = (ulong)(uVar1 * uVar3 * 4);
      }
      else {
LAB_00244ec7:
        if (((byte)uVar11 >> 4 & 1 < uVar8) != 0) {
LAB_00244ed6:
          if (((packing < BufferPackingScalar) && ((0x35U >> (packing & 0x1f) & 1) != 0)) ||
             (uVar3 == 3)) {
            uVar10 = uVar10 * 4;
          }
          else {
            uVar10 = uVar10 * uVar3;
          }
          local_78 = (ulong)uVar10;
        }
      }
      uVar10 = (uint)local_78;
      if ((packing & ~BufferPackingStd430) != BufferPackingHLSLCbuffer || uVar3 < 2)
      goto LAB_00244d37;
      uVar3 = type->width;
      goto LAB_00244cfd;
    }
    uVar10 = uVar1 * type->vecsize * type->columns;
  }
  else {
    uVar1 = to_array_size_literal(this,type);
    uVar2 = type_to_packed_array_stride(this,type,flags,packing);
    uVar10 = uVar2 * uVar1;
    local_78 = (ulong)uVar10;
    if (((packing & ~BufferPackingStd430) != BufferPackingHLSLCbuffer) ||
       (*(int *)&(type->super_IVariant).field_0xc == 0xf)) goto LAB_00244d37;
    uVar3 = type->width;
    uVar8 = type->vecsize;
LAB_00244cfd:
    uVar10 = (uVar3 >> 3) * (uVar8 - 4) + uVar10;
  }
  local_78 = (ulong)uVar10;
LAB_00244d37:
  return (uint32_t)local_78;
}

Assistant:

uint32_t CompilerGLSL::type_to_packed_size(const SPIRType &type, const Bitset &flags, BufferPackingStandard packing)
{
	if (!type.array.empty())
	{
		uint32_t packed_size = to_array_size_literal(type) * type_to_packed_array_stride(type, flags, packing);

		// For arrays of vectors and matrices in HLSL, the last element has a size which depends on its vector size,
		// so that it is possible to pack other vectors into the last element.
		if (packing_is_hlsl(packing) && type.basetype != SPIRType::Struct)
			packed_size -= (4 - type.vecsize) * (type.width / 8);

		return packed_size;
	}

	// If using PhysicalStorageBufferEXT storage class, this is a pointer,
	// and is 64-bit.
	if (type.storage == StorageClassPhysicalStorageBufferEXT)
	{
		if (!type.pointer)
			SPIRV_CROSS_THROW("Types in PhysicalStorageBufferEXT must be pointers.");

		if (ir.addressing_model == AddressingModelPhysicalStorageBuffer64EXT)
			return 8;
		else
			SPIRV_CROSS_THROW("AddressingModelPhysicalStorageBuffer64EXT must be used for PhysicalStorageBufferEXT.");
	}

	uint32_t size = 0;

	if (type.basetype == SPIRType::Struct)
	{
		uint32_t pad_alignment = 1;

		for (uint32_t i = 0; i < type.member_types.size(); i++)
		{
			auto member_flags = ir.meta[type.self].members[i].decoration_flags;
			auto &member_type = get<SPIRType>(type.member_types[i]);

			uint32_t packed_alignment = type_to_packed_alignment(member_type, member_flags, packing);
			uint32_t alignment = max(packed_alignment, pad_alignment);

			// The next member following a struct member is aligned to the base alignment of the struct that came before.
			// GL 4.5 spec, 7.6.2.2.
			if (member_type.basetype == SPIRType::Struct)
				pad_alignment = packed_alignment;
			else
				pad_alignment = 1;

			size = (size + alignment - 1) & ~(alignment - 1);
			size += type_to_packed_size(member_type, member_flags, packing);
		}
	}
	else
	{
		const uint32_t base_alignment = type_to_packed_base_size(type, packing);

		if (packing_is_scalar(packing))
		{
			size = type.vecsize * type.columns * base_alignment;
		}
		else
		{
			if (type.columns == 1)
				size = type.vecsize * base_alignment;

			if (flags.get(DecorationColMajor) && type.columns > 1)
			{
				if (packing_is_vec4_padded(packing))
					size = type.columns * 4 * base_alignment;
				else if (type.vecsize == 3)
					size = type.columns * 4 * base_alignment;
				else
					size = type.columns * type.vecsize * base_alignment;
			}

			if (flags.get(DecorationRowMajor) && type.vecsize > 1)
			{
				if (packing_is_vec4_padded(packing))
					size = type.vecsize * 4 * base_alignment;
				else if (type.columns == 3)
					size = type.vecsize * 4 * base_alignment;
				else
					size = type.vecsize * type.columns * base_alignment;
			}

			// For matrices in HLSL, the last element has a size which depends on its vector size,
			// so that it is possible to pack other vectors into the last element.
			if (packing_is_hlsl(packing) && type.columns > 1)
				size -= (4 - type.vecsize) * (type.width / 8);
		}
	}

	return size;
}